

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O1

int __thiscall CTcMake::read_and_compare_config_str(CTcMake *this,CVmFile *fp,textchar_t *str)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong buflen;
  ulong __n;
  char b [2];
  short local_138 [132];
  
  CVmFile::read_bytes(fp,(char *)local_138,2);
  __n = (ulong)local_138[0];
  if ((str != (textchar_t *)0x0 || __n == 0) && (sVar2 = strlen(str), sVar2 == __n)) {
    do {
      if (__n == 0) {
        return 1;
      }
      buflen = __n;
      if (0xff < __n) {
        buflen = 0x100;
      }
      CVmFile::read_bytes(fp,(char *)local_138,buflen);
      iVar1 = bcmp(str,local_138,__n);
      uVar3 = __n;
      if (iVar1 != 0) {
        uVar3 = 0;
        buflen = 0;
      }
      str = str + uVar3;
      __n = __n - buflen;
    } while (iVar1 == 0);
  }
  return 0;
}

Assistant:

int CTcMake::read_and_compare_config_str(CVmFile *fp, const textchar_t *str)
{
    size_t len;

    /* read the length */
    len = (size_t)fp->read_int2();

    /* if the source string is null, the length must be zero to match */
    if (str == 0 && len != 0)
        return FALSE;

    /* if the lengths don't match, the strings can't match */
    if (len != get_strlen(str))
        return FALSE;

    /* keep going until we exhaust the string */
    while (len != 0)
    {
        char buf[256];
        size_t cur;

        /* read up to a buffer-full, or whatever remains if less */
        cur = sizeof(buf);
        if (len < cur)
            cur = len;

        /* read the data */
        fp->read_bytes(buf, cur);

        /* compare these bytes - if they differ, we don't have a match */
        if (memcmp(str, buf, len) != 0)
            return FALSE;

        /* skip past these bytes of the comparison string */
        str += len;

        /* deduct this amount from the remaining total length */
        len -= cur;
    }

    /* we didn't find any differences - they match */
    return TRUE;
}